

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

precise_unit __thiscall
units::commoditizedUnit(units *this,string *unit_string,precise_unit actUnit,size_t *index)

{
  size_type __pos;
  bool bVar1;
  uint32_t uVar2;
  size_type sVar3;
  size_type *psVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  precise_unit pVar7;
  double local_98;
  precise_unit actUnit_local;
  size_type local_80;
  string commodStr;
  string local_58;
  precise_unit local_38;
  
  psVar4 = actUnit._8_8_;
  actUnit_local.multiplier_ = actUnit.multiplier_;
  actUnit_local._8_8_ = unit_string;
  sVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,'{',0
                    );
  uVar5 = actUnit.multiplier_._0_4_;
  uVar6 = actUnit.multiplier_._4_4_;
  if (sVar3 != 0xffffffffffffffff) {
    __pos = sVar3 + 1;
    local_80 = __pos;
    segmentcheck((string *)this,'}',&local_80);
    if ((local_80 - __pos == 2) && (*(char *)(*(long *)this + __pos) == '#')) {
      *psVar4 = local_80;
      pVar7 = precise_unit::operator*(&actUnit_local,(unit *)&count);
      unit_string = pVar7._8_8_;
      uVar5 = pVar7.multiplier_._0_4_;
      uVar6 = pVar7.multiplier_._4_4_;
    }
    else {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&commodStr,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,__pos,
                 (local_80 - sVar3) - 2);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &commodStr,"cells");
      if (bVar1) {
        *psVar4 = local_80;
        local_38.multiplier_ = 1.0;
        local_38.base_units_ = (unit_data)0x4000000;
        local_38.commodity_ = 0x604335a0;
        pVar7 = precise_unit::operator*(&actUnit_local,&local_38);
        unit_string = pVar7._8_8_;
        local_98 = pVar7.multiplier_;
      }
      else {
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)commodStr._M_dataplus._M_p == &commodStr.field_2) {
          local_58.field_2._8_8_ = commodStr.field_2._8_8_;
        }
        else {
          local_58._M_dataplus._M_p = commodStr._M_dataplus._M_p;
        }
        local_58._M_string_length = commodStr._M_string_length;
        commodStr._M_string_length = 0;
        commodStr.field_2._M_local_buf[0] = '\0';
        commodStr._M_dataplus._M_p = (pointer)&commodStr.field_2;
        uVar2 = getCommodity(&local_58);
        std::__cxx11::string::~string((string *)&local_58);
        *psVar4 = local_80;
        local_98 = actUnit_local.multiplier_;
        unit_string = (string *)CONCAT44(uVar2 | actUnit_local.commodity_,actUnit_local.base_units_)
        ;
      }
      std::__cxx11::string::~string((string *)&commodStr);
      uVar5 = SUB84(local_98,0);
      uVar6 = (undefined4)((ulong)local_98 >> 0x20);
    }
  }
  pVar7.multiplier_._4_4_ = uVar6;
  pVar7.multiplier_._0_4_ = uVar5;
  pVar7._8_8_ = unit_string;
  return pVar7;
}

Assistant:

static precise_unit commoditizedUnit(
    const std::string& unit_string,
    precise_unit actUnit,
    size_t& index)
{
    auto ccindex = unit_string.find_first_of('{');
    if (ccindex == std::string::npos) {
        return actUnit;
    }
    ++ccindex;
    auto start = ccindex;
    segmentcheck(unit_string, '}', ccindex);
    if (ccindex - start == 2) {
        // there are a couple units that might look like commodities
        if (unit_string[start] == '#') {
            index = ccindex;
            return actUnit * count;
        }
    }
    std::string commodStr = unit_string.substr(start, ccindex - start - 1);
    if (commodStr == "cells") {
        index = ccindex;
        return actUnit * precise_unit(1.0, precise::count, commodities::cell);
    }
    auto hcode = getCommodity(std::move(commodStr));
    index = ccindex;
    return {1.0, actUnit, hcode};
}